

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void slideWindows(double ax,double ay,double az,double gx,double gy,double gz,double mx,double my,
                 double mz,double GPSyaw,double GPSv)

{
  double **ppdVar1;
  double **ppdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  long lVar14;
  double in_stack_00000008;
  double in_stack_00000010;
  double in_stack_00000018;
  
  ppdVar1 = *smoothRes;
  ppdVar2 = smoothRes[1];
  pdVar3 = *ppdVar1;
  pdVar4 = ppdVar1[1];
  pdVar5 = ppdVar1[2];
  pdVar6 = *ppdVar2;
  pdVar7 = ppdVar2[1];
  pdVar8 = ppdVar2[2];
  ppdVar1 = smoothRes[2];
  pdVar9 = *ppdVar1;
  pdVar10 = ppdVar1[1];
  pdVar11 = ppdVar1[2];
  pdVar12 = *smoothRes[3];
  pdVar13 = smoothRes[3][1];
  if (firstSmooth == 0) {
    lVar14 = 0;
    do {
      *(double *)((long)pdVar3 + lVar14) = ax;
      *(double *)((long)pdVar4 + lVar14) = ay;
      *(double *)((long)pdVar5 + lVar14) = az;
      *(double *)((long)pdVar6 + lVar14) = gx;
      *(double *)((long)pdVar7 + lVar14) = gy;
      *(double *)((long)pdVar8 + lVar14) = gz;
      *(double *)((long)pdVar9 + lVar14) = mx;
      *(double *)((long)pdVar10 + lVar14) = my;
      *(double *)((long)pdVar11 + lVar14) = in_stack_00000008;
      *(double *)((long)pdVar12 + lVar14) = in_stack_00000010;
      *(double *)((long)pdVar13 + lVar14) = in_stack_00000018;
      lVar14 = lVar14 + 8;
    } while (lVar14 != 0x60);
    firstSmooth = 1;
  }
  else {
    lVar14 = 0;
    do {
      *(undefined8 *)((long)pdVar3 + lVar14) = *(undefined8 *)((long)pdVar3 + lVar14 + 8);
      *(undefined8 *)((long)pdVar4 + lVar14) = *(undefined8 *)((long)pdVar4 + lVar14 + 8);
      *(undefined8 *)((long)pdVar5 + lVar14) = *(undefined8 *)((long)pdVar5 + lVar14 + 8);
      *(undefined8 *)((long)pdVar6 + lVar14) = *(undefined8 *)((long)pdVar6 + lVar14 + 8);
      *(undefined8 *)((long)pdVar7 + lVar14) = *(undefined8 *)((long)pdVar7 + lVar14 + 8);
      *(undefined8 *)((long)pdVar8 + lVar14) = *(undefined8 *)((long)pdVar8 + lVar14 + 8);
      *(undefined8 *)((long)pdVar9 + lVar14) = *(undefined8 *)((long)pdVar9 + lVar14 + 8);
      *(undefined8 *)((long)pdVar10 + lVar14) = *(undefined8 *)((long)pdVar10 + lVar14 + 8);
      *(undefined8 *)((long)pdVar11 + lVar14) = *(undefined8 *)((long)pdVar11 + lVar14 + 8);
      *(undefined8 *)((long)pdVar12 + lVar14) = *(undefined8 *)((long)pdVar12 + lVar14 + 8);
      *(undefined8 *)((long)pdVar13 + lVar14) = *(undefined8 *)((long)pdVar13 + lVar14 + 8);
      lVar14 = lVar14 + 8;
    } while (lVar14 != 0x58);
    pdVar3[0xb] = ax;
    pdVar4[0xb] = ay;
    pdVar5[0xb] = az;
    pdVar6[0xb] = gx;
    pdVar7[0xb] = gy;
    pdVar8[0xb] = gz;
    pdVar9[0xb] = mx;
    pdVar10[0xb] = my;
    pdVar11[0xb] = in_stack_00000008;
    pdVar12[0xb] = in_stack_00000010;
    pdVar13[0xb] = in_stack_00000018;
  }
  return;
}

Assistant:

void slideWindows(double ax, double ay, double az, double gx, double gy, double gz, double mx, double my, double mz,
                  double GPSyaw, double GPSv) {
    if (firstSmooth == 0) {
        for (int i = 0; i < width; i++) {
            smoothRes[0][0][i] = ax;
            smoothRes[0][1][i] = ay;
            smoothRes[0][2][i] = az;
            smoothRes[1][0][i] = gx;
            smoothRes[1][1][i] = gy;
            smoothRes[1][2][i] = gz;
            smoothRes[2][0][i] = mx;
            smoothRes[2][1][i] = my;
            smoothRes[2][2][i] = mz;
            smoothRes[3][0][i] = GPSyaw;
            smoothRes[3][1][i] = GPSv;
        }
        firstSmooth = 1;
    } else {
        for (int i = 1; i < width; i++) {
            smoothRes[0][0][i - 1] = smoothRes[0][0][i];
            smoothRes[0][1][i - 1] = smoothRes[0][1][i];
            smoothRes[0][2][i - 1] = smoothRes[0][2][i];
            smoothRes[1][0][i - 1] = smoothRes[1][0][i];
            smoothRes[1][1][i - 1] = smoothRes[1][1][i];
            smoothRes[1][2][i - 1] = smoothRes[1][2][i];
            smoothRes[2][0][i - 1] = smoothRes[2][0][i];
            smoothRes[2][1][i - 1] = smoothRes[2][1][i];
            smoothRes[2][2][i - 1] = smoothRes[2][2][i];
            smoothRes[3][0][i - 1] = smoothRes[3][0][i];
            smoothRes[3][1][i - 1] = smoothRes[3][1][i];
        }
        smoothRes[0][0][width - 1] = ax;
        smoothRes[0][1][width - 1] = ay;
        smoothRes[0][2][width - 1] = az;
        smoothRes[1][0][width - 1] = gx;
        smoothRes[1][1][width - 1] = gy;
        smoothRes[1][2][width - 1] = gz;
        smoothRes[2][0][width - 1] = mx;
        smoothRes[2][1][width - 1] = my;
        smoothRes[2][2][width - 1] = mz;
        smoothRes[3][0][width - 1] = GPSyaw;
        smoothRes[3][1][width - 1] = GPSv;
    }
}